

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void read_from_buffer(DESCRIPTOR_DATA *d)

{
  char cVar1;
  int iVar2;
  long in_RDI;
  bool bVar3;
  int k;
  int j;
  int i;
  char *in_stack_00000018;
  int in_stack_00000020;
  int local_14;
  int local_10;
  int local_c;
  
  if (*(char *)(in_RDI + 0x4835) != '\0') {
    return;
  }
  local_c = 0;
  while( true ) {
    bVar3 = false;
    if (*(char *)(in_RDI + 0x35 + (long)local_c) != '\n') {
      bVar3 = *(char *)(in_RDI + 0x35 + (long)local_c) != '\r';
    }
    if (!bVar3) break;
    if (*(char *)(in_RDI + 0x35 + (long)local_c) == '\0') {
      return;
    }
    local_c = local_c + 1;
  }
  local_c = 0;
  local_14 = 0;
  while( true ) {
    bVar3 = false;
    if (*(char *)(in_RDI + 0x35 + (long)local_c) != '\n') {
      bVar3 = *(char *)(in_RDI + 0x35 + (long)local_c) != '\r';
    }
    if (!bVar3) goto LAB_005a6c5c;
    if (0x11fd < local_14) break;
    if ((*(char *)(in_RDI + 0x35 + (long)local_c) == '\b') && (0 < local_14)) {
      local_14 = local_14 + -1;
    }
    else if (((*(byte *)(in_RDI + 0x35 + (long)local_c) & 0x80) == 0) &&
            (iVar2 = isprint((int)*(char *)(in_RDI + 0x35 + (long)local_c)), iVar2 != 0)) {
      *(undefined1 *)(in_RDI + 0x4835 + (long)local_14) =
           *(undefined1 *)(in_RDI + 0x35 + (long)local_c);
      local_14 = local_14 + 1;
    }
    local_c = local_c + 1;
  }
  write_to_descriptor(in_stack_00000020,in_stack_00000018,d._4_4_);
  for (; ((*(char *)(in_RDI + 0x35 + (long)local_c) != '\0' &&
          (*(char *)(in_RDI + 0x35 + (long)local_c) != '\n')) &&
         (*(char *)(in_RDI + 0x35 + (long)local_c) != '\r')); local_c = local_c + 1) {
  }
  *(undefined1 *)(in_RDI + 0x35 + (long)local_c) = 10;
  *(undefined1 *)(in_RDI + 0x35 + (long)(local_c + 1)) = 0;
LAB_005a6c5c:
  if (local_14 == 0) {
    local_14 = 1;
    *(undefined1 *)(in_RDI + 0x4835) = 0x20;
  }
  *(undefined1 *)(in_RDI + 0x4835 + (long)local_14) = 0;
  if (*(char *)(in_RDI + 0x4835) == '!') {
    strcpy((char *)(in_RDI + 0x4835),(char *)(in_RDI + 0x5a35));
  }
  else {
    strcpy((char *)(in_RDI + 0x5a35),(char *)(in_RDI + 0x4835));
  }
  while( true ) {
    bVar3 = true;
    if (*(char *)(in_RDI + 0x35 + (long)local_c) != '\n') {
      bVar3 = *(char *)(in_RDI + 0x35 + (long)local_c) == '\r';
    }
    if (!bVar3) break;
    local_c = local_c + 1;
  }
  local_10 = 0;
  while (cVar1 = *(char *)(in_RDI + 0x35 + (long)(local_c + local_10)),
        *(char *)(in_RDI + 0x35 + (long)local_10) = cVar1, cVar1 != '\0') {
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void read_from_buffer(DESCRIPTOR_DATA *d)
{
	int i, j, k;

	/*
	 * Hold horses if pending command already.
	 */
	if (d->incomm[0] != '\0')
		return;

	/*
	 * Look for at least one new line.
	 */
	for (i = 0; d->inbuf[i] != '\n' && d->inbuf[i] != '\r'; i++)
	{
		if (d->inbuf[i] == '\0')
			return;
	}

	/*
	 * Canonical input processing.
	 */
	for (i = 0, k = 0; d->inbuf[i] != '\n' && d->inbuf[i] != '\r'; i++)
	{
		if (k >= MAX_INPUT_LENGTH - 2)
		{
			write_to_descriptor(d->descriptor, "Line too long.\n\r", 0);

			/* skip the rest of the line */
			for (; d->inbuf[i] != '\0'; i++)
			{
				if (d->inbuf[i] == '\n' || d->inbuf[i] == '\r')
					break;
			}

			d->inbuf[i] = '\n';
			d->inbuf[i + 1] = '\0';
			break;
		}

		if (d->inbuf[i] == '\b' && k > 0)
			--k;
		else if (isascii(d->inbuf[i]) && isprint(d->inbuf[i]))
			d->incomm[k++] = d->inbuf[i];
	}

	/*
	 * Finish off the line.
	 */
	if (k == 0)
		d->incomm[k++] = ' ';

	d->incomm[k] = '\0';

	/*
	 * Do '!' substitution.
	 */
	if (d->incomm[0] == '!')
		strcpy(d->incomm, d->inlast);
	else
		strcpy(d->inlast, d->incomm);

	/*
	 * Shift the input buffer.
	 */
	while (d->inbuf[i] == '\n' || d->inbuf[i] == '\r')
		i++;
	for (j = 0; (d->inbuf[j] = d->inbuf[i + j]) != '\0'; j++)
		;
	return;
}